

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

bool __thiscall cmComputeLinkDepends::CheckCircularDependencies(cmComputeLinkDepends *this)

{
  long *plVar1;
  pointer pLVar2;
  pointer pcVar3;
  pointer pcVar4;
  size_t sVar5;
  cmake *this_00;
  string *psVar6;
  ostream *poVar7;
  long *plVar8;
  long lVar9;
  LinkEntry *entry;
  LinkEntry *entry_00;
  cmGraphEdge *ni;
  pointer pcVar10;
  ulong uVar11;
  cmComputeComponentGraph *pcVar12;
  ulong uVar13;
  ulong uVar14;
  long *plVar15;
  uint uVar16;
  bool bVar17;
  ostringstream e;
  string local_210;
  uint local_1ec;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  cmComputeComponentGraph *local_1d0;
  long *local_1c8;
  long *local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pcVar12 = (this->CCG)._M_t.
            super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
            .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl;
  lVar9 = (long)*(pointer *)
                 ((long)&(pcVar12->Components).
                         super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> + 8)
          - *(long *)&(pcVar12->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl;
  bVar17 = lVar9 == 0;
  if (!bVar17) {
    uVar13 = (lVar9 >> 3) * -0x5555555555555555;
    uVar14 = uVar13 + (uVar13 == 0);
    uVar11 = 0;
    local_1e0 = uVar14;
    local_1d8 = uVar13;
    local_1d0 = pcVar12;
    do {
      lVar9 = *(long *)&(pcVar12->Components).
                        super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                        _M_impl.super__Vector_impl_data;
      plVar1 = *(long **)(lVar9 + uVar11 * 0x18);
      plVar15 = *(long **)(lVar9 + 8 + uVar11 * 0x18);
      if (8 < (ulong)((long)plVar15 - (long)plVar1)) {
        if (plVar1 == plVar15) {
          uVar16 = 0;
        }
        else {
          do {
            plVar8 = plVar1 + 1;
            uVar16 = 0;
            if ((this->EntryList).
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                ._M_impl.super__Vector_impl_data._M_start[*plVar1].Kind == Group) {
              uVar16 = 1;
              break;
            }
            plVar1 = plVar8;
          } while (plVar8 != plVar15);
        }
        if (uVar16 != 0) {
          local_1e8 = uVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"The inter-target dependency graph, for the target \"",
                     0x33);
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,
                              psVar6->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"\", contains the following strongly connected component (cycle):\n",
                     0x40);
          plVar1 = (long *)(lVar9 + uVar11 * 0x18);
          plVar15 = (long *)*plVar1;
          local_1c8 = (long *)plVar1[1];
          if (plVar15 != local_1c8) {
            pcVar12 = (this->CCG)._M_t.
                      super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
                      .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl;
            local_1ec = uVar16;
            do {
              lVar9 = *plVar15;
              pLVar2 = (this->EntryList).
                       super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
              const::$_0::operator()::LinkEntry_const___const(&local_210,pLVar2 + lVar9,entry);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_210._M_dataplus._M_p,
                                  local_210._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              local_1c0 = plVar15;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p,
                                local_210.field_2._M_allocated_capacity + 1);
              }
              pcVar3 = (this->EntryConstraintGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_start;
              pcVar4 = *(pointer *)
                        ((long)&pcVar3[lVar9].
                                super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                                super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
              for (pcVar10 = *(pointer *)
                              &pcVar3[lVar9].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>
                               .super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
                  pcVar10 != pcVar4; pcVar10 = pcVar10 + 1) {
                sVar5 = pcVar10->Dest;
                if (*(ulong *)(*(long *)&(pcVar12->TarjanComponents).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl + sVar5 * 8) == local_1e8) {
                  pLVar2 = (this->EntryList).
                           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"    depends on ",0xf);
                  const::$_0::operator()::LinkEntry_const___const
                            (&local_210,pLVar2 + sVar5,entry_00);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,local_210._M_dataplus._M_p,
                                      local_210._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != &local_210.field_2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              plVar15 = local_1c0 + 1;
              uVar16 = local_1ec;
            } while (plVar15 != local_1c8);
          }
          this_00 = this->CMakeInstance;
          std::__cxx11::stringbuf::str();
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1b8);
          cmake::IssueMessage(this_00,FATAL_ERROR,&local_210,(cmListFileBacktrace *)local_1b8);
          uVar11 = local_1e8;
          if ((cmMakefile *)local_1b8._8_8_ != (cmMakefile *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          pcVar12 = local_1d0;
          uVar13 = local_1d8;
          uVar14 = local_1e0;
          if ((uVar16 & 1) != 0) {
            return bVar17;
          }
        }
      }
      uVar11 = uVar11 + 1;
      bVar17 = uVar13 <= uVar11;
    } while (uVar11 != uVar14);
  }
  return bVar17;
}

Assistant:

bool cmComputeLinkDepends::CheckCircularDependencies() const
{
  std::vector<NodeList> const& components = this->CCG->GetComponents();
  size_t nc = components.size();
  for (size_t c = 0; c < nc; ++c) {
    // Get the current component.
    NodeList const& nl = components[c];

    // Skip trivial components.
    if (nl.size() < 2) {
      continue;
    }

    // no group must be evolved
    bool cycleDetected = false;
    for (size_t ni : nl) {
      if (this->EntryList[ni].Kind == LinkEntry::Group) {
        cycleDetected = true;
        break;
      }
    }
    if (!cycleDetected) {
      continue;
    }

    // Construct the error message.
    auto formatItem = [](LinkEntry const& entry) -> std::string {
      if (entry.Kind == LinkEntry::Group) {
        auto items =
          entry.Item.Value.substr(entry.Item.Value.find(':', 12) + 1);
        items.pop_back();
        std::replace(items.begin(), items.end(), '|', ',');
        return cmStrCat("group \"", ExtractGroupFeature(entry.Item.Value),
                        ":{", items, "}\"");
      }
      return cmStrCat('"', entry.Item.Value, '"');
    };

    std::ostringstream e;
    e << "The inter-target dependency graph, for the target \""
      << this->Target->GetName()
      << "\", contains the following strongly connected component "
         "(cycle):\n";
    std::vector<size_t> const& cmap = this->CCG->GetComponentMap();
    for (size_t i : nl) {
      // Get the depender.
      LinkEntry const& depender = this->EntryList[i];

      // Describe the depender.
      e << "  " << formatItem(depender) << "\n";

      // List its dependencies that are inside the component.
      EdgeList const& el = this->EntryConstraintGraph[i];
      for (cmGraphEdge const& ni : el) {
        size_t j = ni;
        if (cmap[j] == c) {
          LinkEntry const& dependee = this->EntryList[j];
          e << "    depends on " << formatItem(dependee) << "\n";
        }
      }
    }
    this->CMakeInstance->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                      this->Target->GetBacktrace());

    return false;
  }

  return true;
}